

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

void __thiscall
cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
          (cubeb_resampler_speex_one_way<short> *this,uint32_t channels,uint32_t source_rate,
          uint32_t target_rate,int quality)

{
  SpeexResamplerState *pSVar1;
  uint in_ECX;
  uint in_EDX;
  uint32_t in_ESI;
  short *in_RDI;
  uint32_t output_frame_count;
  uint32_t input_frame_count;
  short output_buffer [8192];
  short input_buffer [8192];
  size_t LATENCY_SAMPLES;
  uint32_t input_latency;
  int r;
  undefined4 in_stack_ffffffffffff7fd0;
  undefined4 in_stack_ffffffffffff7fd4;
  int in_stack_ffffffffffff7fd8;
  uint in_stack_ffffffffffff7fdc;
  uint in_stack_ffffffffffff7fe0;
  uint in_stack_ffffffffffff7fe4;
  undefined1 local_4028 [16384];
  undefined8 local_28;
  int local_20;
  uint local_14;
  uint local_10;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  processor::processor((processor *)(in_RDI + 4),in_ESI);
  *(undefined ***)in_RDI = &PTR__cubeb_resampler_speex_one_way_0017ff50;
  *(float *)(in_RDI + 0xc) = (float)local_10 / (float)local_14;
  *(uint *)(in_RDI + 0xe) = local_10;
  auto_array<short>::auto_array
            ((auto_array<short> *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),
             in_stack_ffffffffffff7fdc);
  auto_array<short>::auto_array
            ((auto_array<short> *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),
             in_stack_ffffffffffff7fdc);
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  pSVar1 = speex_resampler_init
                     (in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0,in_stack_ffffffffffff7fdc,
                      in_stack_ffffffffffff7fd8,
                      (int *)CONCAT44(in_stack_ffffffffffff7fd4,in_stack_ffffffffffff7fd0));
  *(SpeexResamplerState **)(in_RDI + 8) = pSVar1;
  local_20 = speex_resampler_get_input_latency(*(SpeexResamplerState **)(in_RDI + 8));
  local_28 = 0x2000;
  memset(local_4028,0,0x4000);
  memset(&stack0xffffffffffff7fd8,0,0x4000);
  speex_resample((cubeb_resampler_speex_one_way<short> *)
                 CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),
                 (short *)CONCAT44(in_stack_ffffffffffff7fdc,in_stack_ffffffffffff7fd8),
                 (uint32_t *)CONCAT44(local_20,0x2000),in_RDI,(uint32_t *)0x116685);
  return;
}

Assistant:

cubeb_resampler_speex_one_way(uint32_t channels, uint32_t source_rate,
                                uint32_t target_rate, int quality)
      : processor(channels),
        resampling_ratio(static_cast<float>(source_rate) / target_rate),
        source_rate(source_rate), additional_latency(0), leftover_samples(0)
  {
    int r;
    speex_resampler =
        speex_resampler_init(channels, source_rate, target_rate, quality, &r);
    assert(r == RESAMPLER_ERR_SUCCESS && "resampler allocation failure");

    uint32_t input_latency = speex_resampler_get_input_latency(speex_resampler);
    const size_t LATENCY_SAMPLES = 8192;
    T input_buffer[LATENCY_SAMPLES] = {};
    T output_buffer[LATENCY_SAMPLES] = {};
    uint32_t input_frame_count = input_latency;
    uint32_t output_frame_count = LATENCY_SAMPLES;
    assert(input_latency * channels <= LATENCY_SAMPLES);
    speex_resample(input_buffer, &input_frame_count, output_buffer,
                   &output_frame_count);
  }